

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

Loader * __thiscall stackjit::Loader::getSignature_abi_cxx11_(Loader *this,Function *function)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters;
  anon_class_1_0_00000001 local_59;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_58;
  undefined1 local_38 [40];
  Function *function_local;
  
  local_38._32_8_ = function;
  function_local = (Function *)this;
  Function::name_abi_cxx11_((Function *)local_38);
  parameters = Function::parameters_abi_cxx11_((Function *)local_38._32_8_);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<stackjit::Loader::getSignature(stackjit::Loader::Function_const&)::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_58,&local_59);
  FunctionSignature::createSignature<std::__cxx11::string>
            ((FunctionSignature *)this,(string *)local_38,parameters,&local_58);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_58);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

std::string Loader::getSignature(const Loader::Function& function) {
		return FunctionSignature::createSignature<std::string>(function.name(), function.parameters(), [](std::string str) { return str; });
	}